

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::createSurfaces(MakeCurrentPerfCase *this)

{
  SurfaceType SVar1;
  int surfaceNdx;
  ulong uVar2;
  vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  types;
  SurfaceType local_2c;
  _Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  SVar1 = (this->m_spec).surfaceTypes;
  if ((SVar1 & SURFACETYPE_WINDOW) != 0) {
    local_2c = SURFACETYPE_WINDOW;
    std::
    vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
    ::emplace_back<deqp::egl::MakeCurrentPerfCase::SurfaceType>
              ((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                *)&local_28,&local_2c);
    SVar1 = (this->m_spec).surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PIXMAP) != 0) {
    local_2c = SURFACETYPE_PIXMAP;
    std::
    vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
    ::emplace_back<deqp::egl::MakeCurrentPerfCase::SurfaceType>
              ((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                *)&local_28,&local_2c);
    SVar1 = (this->m_spec).surfaceTypes;
  }
  if ((SVar1 & SURFACETYPE_PBUFFER) != 0) {
    local_2c = SURFACETYPE_PBUFFER;
    std::
    vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
    ::emplace_back<deqp::egl::MakeCurrentPerfCase::SurfaceType>
              ((vector<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
                *)&local_28,&local_2c);
  }
  for (uVar2 = 0; (long)uVar2 < (long)(this->m_spec).surfaceCount; uVar2 = uVar2 + 1) {
    SVar1 = local_28._M_impl.super__Vector_impl_data._M_start
            [uVar2 % (ulong)((long)local_28._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_28._M_impl.super__Vector_impl_data._M_start >> 2)];
    if (SVar1 == SURFACETYPE_PIXMAP) {
      createPixmap(this);
    }
    else if (SVar1 == SURFACETYPE_WINDOW) {
      createWindow(this);
    }
    else if (SVar1 == SURFACETYPE_PBUFFER) {
      createPBuffer(this);
    }
  }
  std::
  _Vector_base<deqp::egl::MakeCurrentPerfCase::SurfaceType,_std::allocator<deqp::egl::MakeCurrentPerfCase::SurfaceType>_>
  ::~_Vector_base(&local_28);
  return;
}

Assistant:

void MakeCurrentPerfCase::createSurfaces (void)
{
	vector<SurfaceType> types;

	if ((m_spec.surfaceTypes & SURFACETYPE_WINDOW) != 0)
		types.push_back(SURFACETYPE_WINDOW);

	if ((m_spec.surfaceTypes & SURFACETYPE_PIXMAP) != 0)
		types.push_back(SURFACETYPE_PIXMAP);

	if ((m_spec.surfaceTypes & SURFACETYPE_PBUFFER) != 0)
		types.push_back(SURFACETYPE_PBUFFER);

	DE_ASSERT((int)types.size() <= m_spec.surfaceCount);

	// Create surfaces
	for (int surfaceNdx = 0; surfaceNdx < m_spec.surfaceCount; surfaceNdx++)
	{
		SurfaceType type = types[surfaceNdx % types.size()];

		switch (type)
		{
			case SURFACETYPE_PBUFFER:
				createPBuffer();
				break;

			case SURFACETYPE_WINDOW:
				createWindow();
				break;

			case SURFACETYPE_PIXMAP:
				createPixmap();
				break;

			default:
				DE_ASSERT(false);
		};
	}
}